

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QLinuxFbDevice::Output>::emplace<QLinuxFbDevice::Output_const&>
          (QGenericArrayOps<QLinuxFbDevice::Output> *this,qsizetype i,Output *args)

{
  Output **ppOVar1;
  qsizetype *pqVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  Data *pDVar5;
  Output *pOVar6;
  undefined8 uVar7;
  QRegionData *pQVar8;
  Data *pDVar9;
  Data *pDVar10;
  Data *pDVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  qreal qVar18;
  qreal qVar19;
  drmModePropertyPtr p_Var20;
  drmModePropertyBlobPtr p_Var21;
  QKmsPlane *pQVar22;
  QSize QVar23;
  Output *pOVar24;
  int iVar25;
  undefined7 uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  undefined4 uVar30;
  undefined3 uVar31;
  bool bVar32;
  bool bVar33;
  undefined3 uVar34;
  char16_t *pcVar35;
  qsizetype qVar36;
  _drmModeModeInfo *p_Var37;
  qsizetype qVar38;
  Data *pDVar39;
  char16_t *pcVar40;
  qsizetype qVar41;
  qsizetype qVar42;
  long lVar43;
  QImage *pQVar44;
  QImage *pQVar45;
  long in_FS_OFFSET;
  bool bVar46;
  Output tmp;
  Inserter local_1f8;
  Output local_1a8;
  long local_38;
  undefined7 uVar14;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar5 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_001190d7:
    memcpy(&local_1a8,&DAT_00143738,0x170);
    local_1a8.kmsOutput.name.d.d = (args->kmsOutput).name.d.d;
    local_1a8.kmsOutput.name.d.ptr = (args->kmsOutput).name.d.ptr;
    local_1a8.kmsOutput.name.d.size = (args->kmsOutput).name.d.size;
    if (local_1a8.kmsOutput.name.d.d != (Data *)0x0) {
      LOCK();
      ((local_1a8.kmsOutput.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_1a8.kmsOutput.name.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.kmsOutput.saved_crtc = (args->kmsOutput).saved_crtc;
    local_1a8.kmsOutput.connector_id = (args->kmsOutput).connector_id;
    local_1a8.kmsOutput.crtc_index = (args->kmsOutput).crtc_index;
    local_1a8.kmsOutput.crtc_id = (args->kmsOutput).crtc_id;
    local_1a8.kmsOutput._36_4_ = *(undefined4 *)&(args->kmsOutput).field_0x24;
    local_1a8.kmsOutput.physical_size.wd = (args->kmsOutput).physical_size.wd;
    local_1a8.kmsOutput.physical_size.ht = (args->kmsOutput).physical_size.ht;
    local_1a8.kmsOutput.preferred_mode = (args->kmsOutput).preferred_mode;
    local_1a8.kmsOutput.mode = (args->kmsOutput).mode;
    local_1a8.kmsOutput.mode_set = (args->kmsOutput).mode_set;
    local_1a8.kmsOutput._65_7_ = *(undefined7 *)&(args->kmsOutput).field_0x41;
    local_1a8.kmsOutput.modes.d.d = (args->kmsOutput).modes.d.d;
    local_1a8.kmsOutput.modes.d.ptr = (args->kmsOutput).modes.d.ptr;
    local_1a8.kmsOutput.modes.d.size = (args->kmsOutput).modes.d.size;
    if (local_1a8.kmsOutput.modes.d.d != (Data *)0x0) {
      LOCK();
      ((local_1a8.kmsOutput.modes.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_1a8.kmsOutput.modes.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.kmsOutput.subpixel = (args->kmsOutput).subpixel;
    local_1a8.kmsOutput._108_4_ = *(undefined4 *)&(args->kmsOutput).field_0x6c;
    local_1a8.kmsOutput.dpms_prop = (args->kmsOutput).dpms_prop;
    local_1a8.kmsOutput.edid_blob = (args->kmsOutput).edid_blob;
    uVar12 = (args->kmsOutput).wants_forced_plane;
    uVar13 = *(undefined3 *)&(args->kmsOutput).field_0x81;
    uVar15 = (args->kmsOutput).forced_plane_id;
    uVar14 = CONCAT43(uVar15,uVar13);
    local_1a8.kmsOutput._137_3_ = *(undefined3 *)&(args->kmsOutput).field_0x89;
    local_1a8.kmsOutput.drm_format = (args->kmsOutput).drm_format;
    local_1a8.kmsOutput.drm_format_requested_by_user =
         (args->kmsOutput).drm_format_requested_by_user;
    local_1a8.kmsOutput.forced_plane_set =
         SUB81((ulong)*(undefined8 *)&(args->kmsOutput).field_0x81 >> 0x38,0);
    local_1a8.kmsOutput.clone_source.d.d = (args->kmsOutput).clone_source.d.d;
    local_1a8.kmsOutput.clone_source.d.ptr = (args->kmsOutput).clone_source.d.ptr;
    local_1a8.kmsOutput.clone_source.d.size = (args->kmsOutput).clone_source.d.size;
    if (local_1a8.kmsOutput.clone_source.d.d != (Data *)0x0) {
      LOCK();
      ((local_1a8.kmsOutput.clone_source.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1a8.kmsOutput.clone_source.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.kmsOutput.available_planes.d.d = (args->kmsOutput).available_planes.d.d;
    local_1a8.kmsOutput.available_planes.d.ptr = (args->kmsOutput).available_planes.d.ptr;
    local_1a8.kmsOutput.available_planes.d.size = (args->kmsOutput).available_planes.d.size;
    if (local_1a8.kmsOutput.available_planes.d.d != (Data *)0x0) {
      LOCK();
      ((local_1a8.kmsOutput.available_planes.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_1a8.kmsOutput.available_planes.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.kmsOutput.eglfs_plane = (args->kmsOutput).eglfs_plane;
    local_1a8.kmsOutput.size = (args->kmsOutput).size;
    local_1a8.kmsOutput.crtcIdPropertyId = (args->kmsOutput).crtcIdPropertyId;
    local_1a8.kmsOutput.modeIdPropertyId = (args->kmsOutput).modeIdPropertyId;
    local_1a8.kmsOutput.activePropertyId = (args->kmsOutput).activePropertyId;
    local_1a8.kmsOutput.mode_blob_id = (args->kmsOutput).mode_blob_id;
    pQVar45 = &args->fb[0].wrapper;
    pQVar44 = &local_1a8.fb[0].wrapper;
    lVar43 = 2;
    local_1a8.kmsOutput.wants_forced_plane = (bool)uVar12;
    local_1a8.kmsOutput._129_7_ = uVar14;
    do {
      uVar7 = *(undefined8 *)(pQVar45 + -0x20);
      uVar16 = *(undefined8 *)(pQVar45 + -0x18);
      uVar17 = *(undefined8 *)(pQVar45 + -8);
      *(undefined8 *)(pQVar44 + -0x10) = *(undefined8 *)(pQVar45 + -0x10);
      *(undefined8 *)(pQVar44 + -8) = uVar17;
      *(undefined8 *)(pQVar44 + -0x20) = uVar7;
      *(undefined8 *)(pQVar44 + -0x18) = uVar16;
      QImage::QImage(pQVar44,pQVar45);
      pQVar45 = pQVar45 + 0x38;
      pQVar44 = pQVar44 + 0x38;
      lVar43 = lVar43 + -1;
    } while (lVar43 != 0);
    lVar43 = 0x158;
    do {
      QRegion::QRegion((QRegion *)((long)&local_1a8.kmsOutput.name.d.d + lVar43),
                       (QRegion *)((long)&(args->kmsOutput).name.d.d + lVar43));
      lVar43 = lVar43 + 8;
    } while (lVar43 != 0x168);
    local_1a8.flipped = args->flipped;
    local_1a8.backFb = args->backFb;
    bVar46 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size != 0;
    QArrayDataPointer<QLinuxFbDevice::Output>::detachAndGrow
              (&this->super_QArrayDataPointer<QLinuxFbDevice::Output>,(uint)(i == 0 && bVar46),1,
               (Output **)0x0,(QArrayDataPointer<QLinuxFbDevice::Output> *)0x0);
    qVar42 = local_1a8.kmsOutput.available_planes.d.size;
    pQVar22 = local_1a8.kmsOutput.available_planes.d.ptr;
    pDVar11 = local_1a8.kmsOutput.available_planes.d.d;
    qVar41 = local_1a8.kmsOutput.clone_source.d.size;
    pcVar40 = local_1a8.kmsOutput.clone_source.d.ptr;
    pDVar39 = local_1a8.kmsOutput.clone_source.d.d;
    qVar38 = local_1a8.kmsOutput.modes.d.size;
    p_Var37 = local_1a8.kmsOutput.modes.d.ptr;
    pDVar10 = local_1a8.kmsOutput.modes.d.d;
    qVar36 = local_1a8.kmsOutput.name.d.size;
    pcVar35 = local_1a8.kmsOutput.name.d.ptr;
    pDVar9 = local_1a8.kmsOutput.name.d.d;
    if (i == 0 && bVar46) {
      pOVar6 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
      lVar43 = 0;
      local_1a8.kmsOutput.name.d.d = (Data *)0x0;
      pOVar6[-1].kmsOutput.name.d.d = pDVar9;
      local_1a8.kmsOutput.name.d.ptr = (char16_t *)0x0;
      pOVar6[-1].kmsOutput.name.d.ptr = pcVar35;
      local_1a8.kmsOutput.name.d.size = 0;
      pOVar6[-1].kmsOutput.name.d.size = qVar36;
      pOVar6[-1].kmsOutput.connector_id = local_1a8.kmsOutput.connector_id;
      pOVar6[-1].kmsOutput.crtc_index = local_1a8.kmsOutput.crtc_index;
      pOVar6[-1].kmsOutput.crtc_id = local_1a8.kmsOutput.crtc_id;
      *(undefined4 *)&pOVar6[-1].kmsOutput.field_0x24 = local_1a8.kmsOutput._36_4_;
      pOVar6[-1].kmsOutput.physical_size.wd = local_1a8.kmsOutput.physical_size.wd;
      pOVar6[-1].kmsOutput.physical_size.ht = local_1a8.kmsOutput.physical_size.ht;
      pOVar6[-1].kmsOutput.preferred_mode = local_1a8.kmsOutput.preferred_mode;
      pOVar6[-1].kmsOutput.mode = local_1a8.kmsOutput.mode;
      pOVar6[-1].kmsOutput.mode_set = local_1a8.kmsOutput.mode_set;
      *(undefined7 *)&pOVar6[-1].kmsOutput.field_0x41 = local_1a8.kmsOutput._65_7_;
      pOVar6[-1].kmsOutput.saved_crtc = local_1a8.kmsOutput.saved_crtc;
      local_1a8.kmsOutput.modes.d.d = (Data *)0x0;
      pOVar6[-1].kmsOutput.modes.d.d = pDVar10;
      local_1a8.kmsOutput.modes.d.ptr = (_drmModeModeInfo *)0x0;
      pOVar6[-1].kmsOutput.modes.d.ptr = p_Var37;
      local_1a8.kmsOutput.modes.d.size = 0;
      pOVar6[-1].kmsOutput.modes.d.size = qVar38;
      pOVar6[-1].kmsOutput.subpixel = local_1a8.kmsOutput.subpixel;
      *(undefined4 *)&pOVar6[-1].kmsOutput.field_0x6c = local_1a8.kmsOutput._108_4_;
      pOVar6[-1].kmsOutput.dpms_prop = local_1a8.kmsOutput.dpms_prop;
      pOVar6[-1].kmsOutput.edid_blob = local_1a8.kmsOutput.edid_blob;
      pOVar6[-1].kmsOutput.wants_forced_plane = local_1a8.kmsOutput.wants_forced_plane;
      *(int3 *)&pOVar6[-1].kmsOutput.field_0x81 = local_1a8.kmsOutput._129_3_;
      pOVar6[-1].kmsOutput.forced_plane_id = local_1a8.kmsOutput.forced_plane_id;
      *(ulong *)&pOVar6[-1].kmsOutput.field_0x81 =
           CONCAT17(local_1a8.kmsOutput.forced_plane_set,local_1a8.kmsOutput._129_7_);
      *(undefined3 *)&pOVar6[-1].kmsOutput.field_0x89 = local_1a8.kmsOutput._137_3_;
      pOVar6[-1].kmsOutput.drm_format = local_1a8.kmsOutput.drm_format;
      pOVar6[-1].kmsOutput.drm_format_requested_by_user =
           local_1a8.kmsOutput.drm_format_requested_by_user;
      local_1a8.kmsOutput.clone_source.d.d = (Data *)0x0;
      pOVar6[-1].kmsOutput.clone_source.d.d = pDVar39;
      local_1a8.kmsOutput.clone_source.d.ptr = (char16_t *)0x0;
      pOVar6[-1].kmsOutput.clone_source.d.ptr = pcVar40;
      local_1a8.kmsOutput.clone_source.d.size = 0;
      pOVar6[-1].kmsOutput.clone_source.d.size = qVar41;
      local_1a8.kmsOutput.available_planes.d.d = (Data *)0x0;
      pOVar6[-1].kmsOutput.available_planes.d.d = pDVar11;
      local_1a8.kmsOutput.available_planes.d.ptr = (QKmsPlane *)0x0;
      pOVar6[-1].kmsOutput.available_planes.d.ptr = pQVar22;
      local_1a8.kmsOutput.available_planes.d.size = 0;
      pOVar6[-1].kmsOutput.available_planes.d.size = qVar42;
      pOVar6[-1].kmsOutput.eglfs_plane = local_1a8.kmsOutput.eglfs_plane;
      pOVar6[-1].kmsOutput.size = local_1a8.kmsOutput.size;
      pOVar6[-1].kmsOutput.crtcIdPropertyId = local_1a8.kmsOutput.crtcIdPropertyId;
      pOVar6[-1].kmsOutput.modeIdPropertyId = local_1a8.kmsOutput.modeIdPropertyId;
      pOVar6[-1].kmsOutput.activePropertyId = local_1a8.kmsOutput.activePropertyId;
      pOVar6[-1].kmsOutput.mode_blob_id = local_1a8.kmsOutput.mode_blob_id;
      do {
        uVar7 = *(undefined8 *)((long)&local_1a8.fb[0].handle + lVar43);
        uVar16 = *(undefined8 *)((long)&local_1a8.fb[0].size + lVar43);
        uVar17 = *(undefined8 *)((long)&local_1a8.fb[0].p + lVar43);
        puVar3 = (undefined8 *)((long)pOVar6 + lVar43 + -0x78);
        *puVar3 = *(undefined8 *)((long)&local_1a8.fb[0].fb + lVar43);
        puVar3[1] = uVar17;
        puVar3 = (undefined8 *)((long)pOVar6 + lVar43 + -0x88);
        *puVar3 = uVar7;
        puVar3[1] = uVar16;
        QPaintDevice::QPaintDevice((QPaintDevice *)((long)pOVar6 + lVar43 + -0x68));
        *(code **)((long)pOVar6 + lVar43 + -0x68) = QStringView::split;
        uVar7 = *(undefined8 *)(&local_1a8.fb[0].field_0x30 + lVar43);
        *(undefined8 *)(&local_1a8.fb[0].field_0x30 + lVar43) = 0;
        *(undefined8 *)((long)pOVar6 + lVar43 + -0x58) = uVar7;
        lVar43 = lVar43 + 0x38;
      } while (lVar43 != 0x70);
      lVar43 = 0;
      do {
        pQVar8 = local_1a8.dirty[lVar43].d;
        local_1a8.dirty[lVar43].d = (QRegionData *)&QRegion::shared_empty;
        *(QRegionData **)((long)pOVar6 + lVar43 * 8 + -0x18) = pQVar8;
        lVar43 = lVar43 + 1;
      } while (lVar43 != 2);
      pOVar6[-1].flipped = local_1a8.flipped;
      pOVar6[-1].backFb = local_1a8.backFb;
      ppOVar1 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
      *ppOVar1 = *ppOVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_1f8.sourceCopyConstruct = 0;
      local_1f8.nSource = 0;
      local_1f8.move = 0;
      local_1f8.sourceCopyAssign = 0;
      local_1f8.end = (Output *)0x0;
      local_1f8.last = (Output *)0x0;
      local_1f8.where = (Output *)0x0;
      local_1f8.begin = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
      local_1f8.size = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
      local_1f8.data = &this->super_QArrayDataPointer<QLinuxFbDevice::Output>;
      Inserter::insertOne(&local_1f8,i,&local_1a8);
      (local_1f8.data)->ptr = local_1f8.begin;
      (local_1f8.data)->size = local_1f8.size;
    }
    QLinuxFbDevice::Output::~Output(&local_1a8);
  }
  else {
    if ((this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size == i) {
      pOVar6 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
      if ((pDVar5->super_QArrayData).alloc - i ==
          ((long)((long)pOVar6 -
                 ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4)
          * -0x2c8590b21642c859) goto LAB_001190bd;
      pDVar9 = (args->kmsOutput).name.d.d;
      pOVar6[i].kmsOutput.name.d.d = pDVar9;
      pOVar6[i].kmsOutput.name.d.ptr = (args->kmsOutput).name.d.ptr;
      pOVar6[i].kmsOutput.name.d.size = (args->kmsOutput).name.d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar9->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pOVar6[i].kmsOutput.saved_crtc = (args->kmsOutput).saved_crtc;
      uVar27 = (args->kmsOutput).connector_id;
      uVar28 = (args->kmsOutput).crtc_index;
      uVar29 = (args->kmsOutput).crtc_id;
      uVar30 = *(undefined4 *)&(args->kmsOutput).field_0x24;
      qVar18 = (args->kmsOutput).physical_size.wd;
      qVar19 = (args->kmsOutput).physical_size.ht;
      iVar25 = (args->kmsOutput).mode;
      bVar46 = (args->kmsOutput).mode_set;
      uVar26 = *(undefined7 *)&(args->kmsOutput).field_0x41;
      pOVar6[i].kmsOutput.preferred_mode = (args->kmsOutput).preferred_mode;
      pOVar6[i].kmsOutput.mode = iVar25;
      pOVar6[i].kmsOutput.mode_set = bVar46;
      *(undefined7 *)&pOVar6[i].kmsOutput.field_0x41 = uVar26;
      pOVar6[i].kmsOutput.physical_size.wd = qVar18;
      pOVar6[i].kmsOutput.physical_size.ht = qVar19;
      pOVar6[i].kmsOutput.connector_id = uVar27;
      pOVar6[i].kmsOutput.crtc_index = uVar28;
      pOVar6[i].kmsOutput.crtc_id = uVar29;
      *(undefined4 *)&pOVar6[i].kmsOutput.field_0x24 = uVar30;
      pDVar10 = (args->kmsOutput).modes.d.d;
      pOVar6[i].kmsOutput.modes.d.d = pDVar10;
      pOVar6[i].kmsOutput.modes.d.ptr = (args->kmsOutput).modes.d.ptr;
      pOVar6[i].kmsOutput.modes.d.size = (args->kmsOutput).modes.d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar25 = (args->kmsOutput).subpixel;
      uVar30 = *(undefined4 *)&(args->kmsOutput).field_0x6c;
      p_Var20 = (args->kmsOutput).dpms_prop;
      p_Var21 = (args->kmsOutput).edid_blob;
      bVar33 = (args->kmsOutput).wants_forced_plane;
      uVar34 = *(undefined3 *)&(args->kmsOutput).field_0x81;
      uVar29 = (args->kmsOutput).forced_plane_id;
      uVar27 = (args->kmsOutput).forced_plane_id;
      bVar46 = (args->kmsOutput).forced_plane_set;
      uVar31 = *(undefined3 *)&(args->kmsOutput).field_0x89;
      uVar28 = (args->kmsOutput).drm_format;
      bVar32 = (args->kmsOutput).drm_format_requested_by_user;
      pOVar24 = pOVar6 + i;
      *(undefined3 *)&(pOVar24->kmsOutput).field_0x81 = *(undefined3 *)&(args->kmsOutput).field_0x81
      ;
      (pOVar24->kmsOutput).forced_plane_id = uVar27;
      (pOVar24->kmsOutput).forced_plane_set = bVar46;
      pOVar24 = pOVar6 + i;
      *(undefined3 *)&(pOVar24->kmsOutput).field_0x89 = uVar31;
      (pOVar24->kmsOutput).drm_format = uVar28;
      (pOVar24->kmsOutput).drm_format_requested_by_user = bVar32;
      pOVar6[i].kmsOutput.edid_blob = p_Var21;
      pOVar24 = pOVar6 + i;
      (pOVar24->kmsOutput).wants_forced_plane = bVar33;
      *(undefined3 *)&(pOVar24->kmsOutput).field_0x81 = uVar34;
      (pOVar24->kmsOutput).forced_plane_id = uVar29;
      pOVar6[i].kmsOutput.subpixel = iVar25;
      *(undefined4 *)&pOVar6[i].kmsOutput.field_0x6c = uVar30;
      pOVar6[i].kmsOutput.dpms_prop = p_Var20;
      pDVar9 = (args->kmsOutput).clone_source.d.d;
      pOVar6[i].kmsOutput.clone_source.d.d = pDVar9;
      pOVar6[i].kmsOutput.clone_source.d.ptr = (args->kmsOutput).clone_source.d.ptr;
      pOVar6[i].kmsOutput.clone_source.d.size = (args->kmsOutput).clone_source.d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->kmsOutput).available_planes.d.d;
      pOVar6[i].kmsOutput.available_planes.d.d = pDVar11;
      pOVar6[i].kmsOutput.available_planes.d.ptr = (args->kmsOutput).available_planes.d.ptr;
      pOVar6[i].kmsOutput.available_planes.d.size = (args->kmsOutput).available_planes.d.size;
      if (pDVar11 != (Data *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar22 = (args->kmsOutput).eglfs_plane;
      QVar23 = (args->kmsOutput).size;
      uVar27 = (args->kmsOutput).modeIdPropertyId;
      uVar28 = (args->kmsOutput).activePropertyId;
      uVar29 = (args->kmsOutput).mode_blob_id;
      pOVar6[i].kmsOutput.crtcIdPropertyId = (args->kmsOutput).crtcIdPropertyId;
      pOVar6[i].kmsOutput.modeIdPropertyId = uVar27;
      pOVar6[i].kmsOutput.activePropertyId = uVar28;
      pOVar6[i].kmsOutput.mode_blob_id = uVar29;
      pOVar6[i].kmsOutput.eglfs_plane = pQVar22;
      pOVar6[i].kmsOutput.size = QVar23;
      pQVar45 = &args->fb[0].wrapper;
      pQVar44 = &pOVar6[i].fb[0].wrapper;
      lVar43 = 2;
      do {
        uVar7 = *(undefined8 *)(pQVar45 + -0x20);
        uVar16 = *(undefined8 *)(pQVar45 + -0x18);
        uVar17 = *(undefined8 *)(pQVar45 + -8);
        *(undefined8 *)(pQVar44 + -0x10) = *(undefined8 *)(pQVar45 + -0x10);
        *(undefined8 *)(pQVar44 + -8) = uVar17;
        *(undefined8 *)(pQVar44 + -0x20) = uVar7;
        *(undefined8 *)(pQVar44 + -0x18) = uVar16;
        QImage::QImage(pQVar44,pQVar45);
        pQVar45 = pQVar45 + 0x38;
        pQVar44 = pQVar44 + 0x38;
        lVar43 = lVar43 + -1;
      } while (lVar43 != 0);
      lVar43 = 0;
      do {
        QRegion::QRegion((QRegion *)((long)&pOVar6[i].dirty[0].d + lVar43),
                         (QRegion *)((long)&args->dirty[0].d + lVar43));
        lVar43 = lVar43 + 8;
      } while (lVar43 != 0x10);
      pOVar6[i].flipped = args->flipped;
      pOVar6[i].backFb = args->backFb;
    }
    else {
LAB_001190bd:
      if ((i != 0) ||
         (pOVar6 = (this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr,
         (Output *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pOVar6)) goto LAB_001190d7;
      pDVar9 = (args->kmsOutput).name.d.d;
      pOVar6[-1].kmsOutput.name.d.d = pDVar9;
      pOVar6[-1].kmsOutput.name.d.ptr = (args->kmsOutput).name.d.ptr;
      pOVar6[-1].kmsOutput.name.d.size = (args->kmsOutput).name.d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar9->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pOVar6[-1].kmsOutput.saved_crtc = (args->kmsOutput).saved_crtc;
      uVar27 = (args->kmsOutput).connector_id;
      uVar28 = (args->kmsOutput).crtc_index;
      uVar29 = (args->kmsOutput).crtc_id;
      uVar30 = *(undefined4 *)&(args->kmsOutput).field_0x24;
      qVar18 = (args->kmsOutput).physical_size.wd;
      qVar19 = (args->kmsOutput).physical_size.ht;
      iVar25 = (args->kmsOutput).mode;
      bVar46 = (args->kmsOutput).mode_set;
      uVar26 = *(undefined7 *)&(args->kmsOutput).field_0x41;
      pOVar6[-1].kmsOutput.preferred_mode = (args->kmsOutput).preferred_mode;
      pOVar6[-1].kmsOutput.mode = iVar25;
      pOVar6[-1].kmsOutput.mode_set = bVar46;
      *(undefined7 *)&pOVar6[-1].kmsOutput.field_0x41 = uVar26;
      pOVar6[-1].kmsOutput.physical_size.wd = qVar18;
      pOVar6[-1].kmsOutput.physical_size.ht = qVar19;
      pOVar6[-1].kmsOutput.connector_id = uVar27;
      pOVar6[-1].kmsOutput.crtc_index = uVar28;
      pOVar6[-1].kmsOutput.crtc_id = uVar29;
      *(undefined4 *)&pOVar6[-1].kmsOutput.field_0x24 = uVar30;
      pDVar10 = (args->kmsOutput).modes.d.d;
      pOVar6[-1].kmsOutput.modes.d.d = pDVar10;
      pOVar6[-1].kmsOutput.modes.d.ptr = (args->kmsOutput).modes.d.ptr;
      pOVar6[-1].kmsOutput.modes.d.size = (args->kmsOutput).modes.d.size;
      if (pDVar10 != (Data *)0x0) {
        LOCK();
        (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar25 = (args->kmsOutput).subpixel;
      uVar30 = *(undefined4 *)&(args->kmsOutput).field_0x6c;
      p_Var20 = (args->kmsOutput).dpms_prop;
      p_Var21 = (args->kmsOutput).edid_blob;
      bVar33 = (args->kmsOutput).wants_forced_plane;
      uVar34 = *(undefined3 *)&(args->kmsOutput).field_0x81;
      uVar29 = (args->kmsOutput).forced_plane_id;
      uVar27 = (args->kmsOutput).forced_plane_id;
      bVar46 = (args->kmsOutput).forced_plane_set;
      uVar31 = *(undefined3 *)&(args->kmsOutput).field_0x89;
      uVar28 = (args->kmsOutput).drm_format;
      bVar32 = (args->kmsOutput).drm_format_requested_by_user;
      *(undefined3 *)&pOVar6[-1].kmsOutput.field_0x81 = *(undefined3 *)&(args->kmsOutput).field_0x81
      ;
      pOVar6[-1].kmsOutput.forced_plane_id = uVar27;
      pOVar6[-1].kmsOutput.forced_plane_set = bVar46;
      *(undefined3 *)&pOVar6[-1].kmsOutput.field_0x89 = uVar31;
      pOVar6[-1].kmsOutput.drm_format = uVar28;
      pOVar6[-1].kmsOutput.drm_format_requested_by_user = bVar32;
      pOVar6[-1].kmsOutput.edid_blob = p_Var21;
      pOVar6[-1].kmsOutput.wants_forced_plane = bVar33;
      *(undefined3 *)&pOVar6[-1].kmsOutput.field_0x81 = uVar34;
      pOVar6[-1].kmsOutput.forced_plane_id = uVar29;
      pOVar6[-1].kmsOutput.subpixel = iVar25;
      *(undefined4 *)&pOVar6[-1].kmsOutput.field_0x6c = uVar30;
      pOVar6[-1].kmsOutput.dpms_prop = p_Var20;
      pDVar9 = (args->kmsOutput).clone_source.d.d;
      pOVar6[-1].kmsOutput.clone_source.d.d = pDVar9;
      pOVar6[-1].kmsOutput.clone_source.d.ptr = (args->kmsOutput).clone_source.d.ptr;
      pOVar6[-1].kmsOutput.clone_source.d.size = (args->kmsOutput).clone_source.d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar11 = (args->kmsOutput).available_planes.d.d;
      pOVar6[-1].kmsOutput.available_planes.d.d = pDVar11;
      pOVar6[-1].kmsOutput.available_planes.d.ptr = (args->kmsOutput).available_planes.d.ptr;
      pOVar6[-1].kmsOutput.available_planes.d.size = (args->kmsOutput).available_planes.d.size;
      if (pDVar11 != (Data *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar22 = (args->kmsOutput).eglfs_plane;
      QVar23 = (args->kmsOutput).size;
      uVar27 = (args->kmsOutput).modeIdPropertyId;
      uVar28 = (args->kmsOutput).activePropertyId;
      uVar29 = (args->kmsOutput).mode_blob_id;
      pOVar6[-1].kmsOutput.crtcIdPropertyId = (args->kmsOutput).crtcIdPropertyId;
      pOVar6[-1].kmsOutput.modeIdPropertyId = uVar27;
      pOVar6[-1].kmsOutput.activePropertyId = uVar28;
      pOVar6[-1].kmsOutput.mode_blob_id = uVar29;
      pOVar6[-1].kmsOutput.eglfs_plane = pQVar22;
      pOVar6[-1].kmsOutput.size = QVar23;
      lVar43 = 0;
      do {
        puVar3 = (undefined8 *)((long)&args->fb[0].handle + lVar43);
        uVar7 = *puVar3;
        uVar16 = puVar3[1];
        puVar3 = (undefined8 *)((long)&args->fb[0].fb + lVar43);
        uVar17 = puVar3[1];
        puVar4 = (undefined8 *)((long)pOVar6 + lVar43 + -0x78);
        *puVar4 = *puVar3;
        puVar4[1] = uVar17;
        puVar3 = (undefined8 *)((long)pOVar6 + lVar43 + -0x88);
        *puVar3 = uVar7;
        puVar3[1] = uVar16;
        QImage::QImage((QImage *)((long)pOVar6 + lVar43 + -0x68),&args->fb[0].wrapper + lVar43);
        lVar43 = lVar43 + 0x38;
      } while (lVar43 != 0x70);
      lVar43 = 0;
      do {
        QRegion::QRegion((QRegion *)((long)pOVar6 + lVar43 + -0x18),
                         (QRegion *)((long)&args->dirty[0].d + lVar43));
        lVar43 = lVar43 + 8;
      } while (lVar43 != 0x10);
      pOVar6[-1].flipped = args->flipped;
      pOVar6[-1].backFb = args->backFb;
      ppOVar1 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).ptr;
      *ppOVar1 = *ppOVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<QLinuxFbDevice::Output>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }